

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O3

CPAccessResult teehbr_access(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  uint uVar1;
  
  if ((env->features & 0x200) == 0) {
    if (env->aarch64 == 0) {
      if ((env->uncached_cpsr & 0x1f) != 0x10) {
        return CP_ACCESS_OK;
      }
      goto LAB_0061c67f;
    }
    uVar1 = env->pstate >> 2 & 3;
  }
  else {
    if ((env->v7m).exception != 0) {
      return CP_ACCESS_OK;
    }
    uVar1 = ~(env->v7m).control[(env->v7m).secure] & 1;
  }
  if (uVar1 != 0) {
    return CP_ACCESS_OK;
  }
LAB_0061c67f:
  if ((env->teecr & 1) == 0) {
    return CP_ACCESS_OK;
  }
  return CP_ACCESS_TRAP;
}

Assistant:

static inline int arm_current_el(CPUARMState *env)
{
    if (arm_feature(env, ARM_FEATURE_M)) {
        return arm_v7m_is_handler_mode(env) ||
            !(env->v7m.control[env->v7m.secure] & 1);
    }

    if (is_a64(env)) {
        return extract32(env->pstate, 2, 2);
    }

    switch (env->uncached_cpsr & 0x1f) {
    case ARM_CPU_MODE_USR:
        return 0;
    case ARM_CPU_MODE_HYP:
        return 2;
    case ARM_CPU_MODE_MON:
        return 3;
    default:
        if (arm_is_secure(env) && !arm_el_is_aa64(env, 3)) {
            /* If EL3 is 32-bit then all secure privileged modes run in
             * EL3
             */
            return 3;
        }

        return 1;
    }
}